

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_man.cpp
# Opt level: O0

bool __thiscall CmdMan::Execute(CmdMan *this)

{
  byte bVar1;
  size_type sVar2;
  ostream *poVar3;
  reference pvVar4;
  mapped_type *pmVar5;
  string local_278 [8];
  string s;
  istream local_258 [8];
  ifstream fin;
  allocator local_39;
  string local_38 [8];
  string path;
  CmdMan *this_local;
  
  sVar2 = std::__cxx11::
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&(this->super_Command).option);
  if (sVar2 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"man: invalid option");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    return false;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"manual/",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  pvVar4 = std::__cxx11::
           list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::front(&(this->super_Command).parameter);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CommandType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CommandType>_>_>
           ::operator[](&commandMap_abi_cxx11_,pvVar4);
  switch(*pmVar5) {
  case CMD_INVA:
    poVar3 = std::operator<<((ostream *)&std::cout,"No manual entry for ");
    pvVar4 = std::__cxx11::
             list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::front(&(this->super_Command).parameter);
    poVar3 = std::operator<<(poVar3,(string *)pvVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = false;
    goto LAB_00119b2e;
  case CMD_CP:
    std::__cxx11::string::operator+=(local_38,"cp");
    break;
  case CMD_CMP:
    std::__cxx11::string::operator+=(local_38,"cmp");
    break;
  case CMD_WC:
    std::__cxx11::string::operator+=(local_38,"wc");
    break;
  case CMD_CAT:
    std::__cxx11::string::operator+=(local_38,"cat");
    break;
  case CMD_MAN:
    std::__cxx11::string::operator+=(local_38,"man");
    break;
  case CMD_SH:
    std::__cxx11::string::operator+=(local_38,"sh");
  }
  std::ifstream::ifstream(local_258,local_38,_S_in);
  while (bVar1 = std::ios::eof(), ((bVar1 ^ 0xff) & 1) != 0) {
    std::__cxx11::string::string(local_278);
    std::getline<char,std::char_traits<char>,std::allocator<char>>(local_258,local_278);
    poVar3 = std::operator<<((ostream *)&std::cout,local_278);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_278);
  }
  this_local._7_1_ = true;
  std::ifstream::~ifstream(local_258);
LAB_00119b2e:
  std::__cxx11::string::~string(local_38);
  return this_local._7_1_;
}

Assistant:

bool CmdMan::Execute(){
	if(option.size() != 0){
		cout << "man: invalid option" << endl;
		return false;
	}
	string path("manual/");
	switch(commandMap[parameter.front()]){
	case CMD_INVA:
		cout << "No manual entry for " << parameter.front() << endl;
		return false;
	case CMD_CP:
		path += "cp";
		break;
	case CMD_CMP:
		path += "cmp";
		break;
	case CMD_WC:
		path += "wc";
		break;
	case CMD_CAT:
		path += "cat";
		break;
	case CMD_MAN:
		path += "man";
		break;
	case CMD_SH:
		path += "sh";
		break;
	}
	ifstream fin(path);
	while(!fin.eof()){
		string s;
		getline(fin, s);
		cout << s << endl;
	}

	return true;
}